

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void sync_read(AV1LfSync *lf_sync,int r,int c,int plane)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  pthread_mutex_t *mutex;
  int nsync;
  
  iVar1 = *(int *)(in_RDI + 0x48);
  if ((in_ESI != 0) && ((in_EDX & iVar1 - 1U) == 0)) {
    __mutex = (pthread_mutex_t *)(*(long *)(in_RDI + (long)in_ECX * 8) + (long)(in_ESI + -1) * 0x28)
    ;
    pthread_mutex_lock(__mutex);
    while (*(int *)(*(long *)(in_RDI + 0x30 + (long)in_ECX * 8) + (long)(in_ESI + -1) * 4) - iVar1 <
           (int)in_EDX) {
      pthread_cond_wait((pthread_cond_t *)
                        (*(long *)(in_RDI + 0x18 + (long)in_ECX * 8) + (long)(in_ESI + -1) * 0x30),
                        __mutex);
    }
    pthread_mutex_unlock(__mutex);
  }
  return;
}

Assistant:

static inline void sync_read(AV1DecRowMTSync *const dec_row_mt_sync, int r,
                             int c) {
#if CONFIG_MULTITHREAD
  const int nsync = dec_row_mt_sync->sync_range;

  if (r && !(c & (nsync - 1))) {
    pthread_mutex_t *const mutex = &dec_row_mt_sync->mutex_[r - 1];
    pthread_mutex_lock(mutex);

    while (c > dec_row_mt_sync->cur_sb_col[r - 1] - nsync -
                   dec_row_mt_sync->intrabc_extra_top_right_sb_delay) {
      pthread_cond_wait(&dec_row_mt_sync->cond_[r - 1], mutex);
    }
    pthread_mutex_unlock(mutex);
  }
#else
  (void)dec_row_mt_sync;
  (void)r;
  (void)c;
#endif  // CONFIG_MULTITHREAD
}